

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O2

bool __thiscall
Protocol::MQTT::V5::Property<Protocol::MQTT::Common::DynamicStringPair>::acceptVisitor
          (Property<Protocol::MQTT::Common::DynamicStringPair> *this,VisitorVariant *visitor)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  bool bVar8;
  bool bVar9;
  
  bVar8 = PropertyBase::acceptVisitor(&this->super_PropertyBase,visitor);
  bVar9 = visitor->type == '\x06';
  if (bVar9 && bVar8) {
    uVar1 = this->field_0x2a;
    visitor->buffer[0x20] = this->field_0x29;
    visitor->buffer[0x21] = uVar1;
    uVar1 = this->field_0x2c;
    uVar2 = this->field_0x2d;
    uVar3 = this->field_0x2e;
    uVar4 = this->field_0x2f;
    uVar5 = this->field_0x30;
    uVar6 = this->field_0x31;
    uVar7 = this->field_0x32;
    visitor->buffer[0x22] = this->field_0x2b;
    visitor->buffer[0x23] = uVar1;
    visitor->buffer[0x24] = uVar2;
    visitor->buffer[0x25] = uVar3;
    visitor->buffer[0x26] = uVar4;
    visitor->buffer[0x27] = uVar5;
    visitor->buffer[0x28] = uVar6;
    visitor->buffer[0x29] = uVar7;
    uVar1 = this->field_0x3c;
    visitor->buffer[0x3a] = this->field_0x3b;
    visitor->buffer[0x3b] = uVar1;
    uVar1 = this->field_0x3e;
    uVar2 = this->field_0x3f;
    uVar3 = this->field_0x40;
    uVar4 = this->field_0x41;
    uVar5 = this->field_0x42;
    uVar6 = this->field_0x43;
    uVar7 = this->field_0x44;
    visitor->buffer[0x3c] = this->field_0x3d;
    visitor->buffer[0x3d] = uVar1;
    visitor->buffer[0x3e] = uVar2;
    visitor->buffer[0x3f] = uVar3;
    visitor->buffer[0x40] = uVar4;
    visitor->buffer[0x41] = uVar5;
    visitor->buffer[0x42] = uVar6;
    visitor->buffer[0x43] = uVar7;
  }
  return bVar9 && bVar8;
}

Assistant:

bool acceptVisitor(VisitorVariant & visitor) const
                {
                    if (!PropertyBase::acceptVisitor(visitor)) return false;
                    DynamicStringPairView * view = visitor.as<DynamicStringPairView>();
                    if (!view) return false;
                    view->key = value.key;
                    view->value = value.value;
                    return true;
                }